

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sliding_average.hpp
# Opt level: O0

void __thiscall
libtorrent::aux::sliding_average<int,_30>::add_sample(sliding_average<int,_30> *this,int s)

{
  int local_24;
  int deviation;
  int s_local;
  sliding_average<int,_30> *this_local;
  
  if (this->m_num_samples < 1) {
    local_24 = 0;
  }
  else {
    local_24 = this->m_mean + s * -0x40;
    if (local_24 < 1) {
      local_24 = -local_24;
    }
  }
  if (this->m_num_samples < 0x1e) {
    this->m_num_samples = this->m_num_samples + 1;
  }
  this->m_mean = (s * 0x40 - this->m_mean) / this->m_num_samples + this->m_mean;
  if (1 < this->m_num_samples) {
    this->m_average_deviation =
         (local_24 - this->m_average_deviation) / (this->m_num_samples + -1) +
         this->m_average_deviation;
  }
  return;
}

Assistant:

void add_sample(Int s)
	{
		TORRENT_ASSERT(s < std::numeric_limits<Int>::max() / 64);
		// fixed point
		s *= 64;
		Int const deviation = (m_num_samples > 0) ? std::abs(m_mean - s) : 0;

		if (m_num_samples < inverted_gain)
			++m_num_samples;

		m_mean += (s - m_mean) / m_num_samples;

		if (m_num_samples > 1) {
			// the exact same thing for deviation off the mean except -1 on
			// the samples, because the number of deviation samples always lags
			// behind by 1 (you need to actual samples to have a single deviation
			// sample).
			m_average_deviation += (deviation - m_average_deviation) / (m_num_samples - 1);
		}
	}